

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void deqp::egl::Image::framebufferRenderbuffer(Functions *gl,GLenum attachment,GLuint rbo)

{
  GLenum GVar1;
  NotSupportedError *this;
  char *__s;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*gl->framebufferRenderbuffer)(0x8d40,attachment,0x8d41,rbo);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x167);
  GVar1 = (*gl->checkFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cd5) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  __s = glu::getFramebufferAttachmentName(attachment);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
  std::operator+(&local_58,"EGLImage as ",&local_78);
  std::operator+(&local_38,&local_58," not supported");
  tcu::NotSupportedError::NotSupportedError
            (this,local_38._M_dataplus._M_p,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x16a);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void framebufferRenderbuffer (const glw::Functions& gl, GLenum attachment, GLuint rbo)
{
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo));
	TCU_CHECK_AND_THROW(NotSupportedError,
						gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE,
						("EGLImage as " + string(glu::getFramebufferAttachmentName(attachment)) + " not supported").c_str());
}